

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxConditional::Resolve(FxConditional *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  FxExpression *this_00;
  PPointer *pPVar2;
  PType *pPVar3;
  FxConditional *pFVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxExpression *pFVar7;
  PInt **ppPVar8;
  FxBoolCast *this_01;
  undefined4 extraout_var_02;
  FxFloatCast *pFVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PPointer *pPVar10;
  PPointer *pPVar11;
  FCompileContext *size;
  FxConditional *pFVar12;
  ExpVal condval;
  undefined4 extraout_var_01;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  size = ctx;
  if (this->condition != (FxExpression *)0x0) {
    iVar6 = (*this->condition->_vptr_FxExpression[2])();
    this->condition = (FxExpression *)CONCAT44(extraout_var,iVar6);
  }
  ppFVar1 = &this->truex;
  if (this->truex != (FxExpression *)0x0) {
    size = ctx;
    iVar6 = (*this->truex->_vptr_FxExpression[2])();
    *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_00,iVar6);
  }
  if (this->falsex == (FxExpression *)0x0) {
    pFVar7 = (FxExpression *)0x0;
  }
  else {
    size = ctx;
    iVar6 = (*this->falsex->_vptr_FxExpression[2])();
    pFVar7 = (FxExpression *)CONCAT44(extraout_var_01,iVar6);
    this->falsex = pFVar7;
  }
  if (((this->condition == (FxExpression *)0x0) ||
      (this_00 = *ppFVar1, this_00 == (FxExpression *)0x0)) || (pFVar7 == (FxExpression *)0x0)) {
LAB_0051010c:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxConditional *)0x0;
  }
  else {
    pPVar11 = (PPointer *)this_00->ValueType;
    if ((PPointer *)this_00->ValueType != (PPointer *)pFVar7->ValueType) {
      bVar5 = FxExpression::IsInteger(this_00);
      if ((bVar5) && (bVar5 = FxExpression::IsInteger(this->falsex), bVar5)) {
        ppPVar8 = &TypeSInt32;
      }
      else {
        iVar6 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
        if (((char)iVar6 == '\0') ||
           (iVar6 = (*(this->falsex->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
           (char)iVar6 == '\0')) {
          pPVar11 = (PPointer *)this->truex->ValueType;
          bVar5 = (pPVar11->super_PBasicType).super_PType.RegType == '\x03';
          size = (FCompileContext *)CONCAT71((int7)((ulong)size >> 8),bVar5);
          pPVar2 = (PPointer *)this->falsex->ValueType;
          if (!bVar5 || pPVar2 != TypeNullPtr) {
            pPVar10 = pPVar2;
            if (pPVar11 != TypeNullPtr) {
              pPVar10 = (PPointer *)TypeVoid;
            }
            pPVar11 = pPVar10;
            if ((pPVar2->super_PBasicType).super_PType.RegType != '\x03') {
              pPVar11 = (PPointer *)TypeVoid;
            }
          }
          goto LAB_0051002d;
        }
        ppPVar8 = (PInt **)&TypeFloat64;
      }
      pPVar11 = (PPointer *)*ppPVar8;
    }
LAB_0051002d:
    (this->super_FxExpression).ValueType = (PType *)pPVar11;
    pFVar7 = this->condition;
    if (pFVar7->ValueType != (PType *)TypeBool) {
      this_01 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
      FxBoolCast::FxBoolCast(this_01,this->condition,true);
      this->condition = (FxExpression *)this_01;
      size = ctx;
      iVar6 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01);
      pFVar7 = (FxExpression *)CONCAT44(extraout_var_02,iVar6);
      this->condition = pFVar7;
      if (pFVar7 == (FxExpression *)0x0) goto LAB_0051010c;
    }
    iVar6 = (*pFVar7->_vptr_FxExpression[3])();
    if ((char)iVar6 == '\0') {
      pPVar3 = (this->super_FxExpression).ValueType;
      if ((pPVar3->RegType == '\x01') && (pPVar3->RegCount == '\x01')) {
        if ((*ppFVar1)->ValueType->RegType != '\x01') {
          pFVar9 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)size);
          FxFloatCast::FxFloatCast(pFVar9,*ppFVar1);
          *ppFVar1 = (FxExpression *)pFVar9;
          size = ctx;
          iVar6 = (*(pFVar9->super_FxExpression)._vptr_FxExpression[2])(pFVar9);
          *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_03,iVar6);
        }
        if (this->falsex->ValueType->RegType != '\x01') {
          pFVar9 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)size);
          FxFloatCast::FxFloatCast(pFVar9,this->falsex);
          this->falsex = (FxExpression *)pFVar9;
          iVar6 = (*(pFVar9->super_FxExpression)._vptr_FxExpression[2])(pFVar9,ctx);
          this->falsex = (FxExpression *)CONCAT44(extraout_var_04,iVar6);
        }
      }
    }
    else {
      ExpVal::ExpVal(&condval,(ExpVal *)(this->condition + 1));
      bVar5 = ExpVal::GetBool(&condval);
      pFVar12 = (FxConditional *)this->truex;
      pFVar4 = (FxConditional *)this->falsex;
      if (bVar5) {
        pFVar12 = (FxConditional *)this->falsex;
        pFVar4 = (FxConditional *)this->truex;
      }
      if (pFVar12 != (FxConditional *)0x0) {
        (*(pFVar12->super_FxExpression)._vptr_FxExpression[1])();
      }
      *ppFVar1 = (FxExpression *)0x0;
      this->falsex = (FxExpression *)0x0;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      ExpVal::~ExpVal(&condval);
      this = pFVar4;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxConditional::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(condition, ctx);
	RESOLVE(truex, ctx);
	RESOLVE(falsex, ctx);
	ABORT(condition && truex && falsex);

	if (truex->ValueType == falsex->ValueType)
		ValueType = truex->ValueType;
	else if (truex->ValueType == TypeBool && falsex->ValueType == TypeBool)
		ValueType = TypeBool;
	else if (truex->IsInteger() && falsex->IsInteger())
		ValueType = TypeSInt32;
	else if (truex->IsNumeric() && falsex->IsNumeric())
		ValueType = TypeFloat64;
	else if (truex->IsPointer() && falsex->ValueType == TypeNullPtr)
		ValueType = truex->ValueType;
	else if (falsex->IsPointer() && truex->ValueType == TypeNullPtr)
		ValueType = falsex->ValueType;
	else
		ValueType = TypeVoid;
	//else if (truex->ValueType != falsex->ValueType)

	if (ValueType->GetRegType() == REGT_NIL)
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible types for ?: operator");
		delete this;
		return nullptr;
	}

	if (condition->ValueType != TypeBool)
	{
		condition = new FxBoolCast(condition);
		SAFE_RESOLVE(condition, ctx);
	}

	if (condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result? truex:falsex;
		delete (result? falsex:truex);
		falsex = truex = nullptr;
		delete this;
		return e;
	}

	if (IsFloat())
	{
		if (truex->ValueType->GetRegType() != REGT_FLOAT)
		{
			truex = new FxFloatCast(truex);
			RESOLVE(truex, ctx);
		}
		if (falsex->ValueType->GetRegType() != REGT_FLOAT)
		{
			falsex = new FxFloatCast(falsex);
			RESOLVE(falsex, ctx);
		}
	}

	return this;
}